

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

int find_lower_bound(__m128i *PrevHi,__m128i *PrevLow,uint32_t key,uint32_t *presult)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  uint uVar6;
  __m128i *local_200;
  uint local_1bc;
  int local_1b4;
  __m128i p;
  __m128i *out;
  __m128i tmp;
  __m128i conversion;
  __m128i key4;
  uint32_t mask;
  int s;
  int offset;
  uint32_t *presult_local;
  uint32_t key_local;
  __m128i *PrevLow_local;
  
  local_1b4 = 0;
  uVar6 = key + 0x80000000;
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  auVar1 = vpinsrd_avx(auVar1,uVar6,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
  auVar2 = vpinsrd_avx(auVar2,0x80000000,2);
  auVar2 = vpinsrd_avx(auVar2,0x80000000,3);
  auVar3 = vpsubd_avx((undefined1  [16])*PrevLow,auVar2);
  uVar4 = vpcmpgtd_avx512vl(auVar1,auVar3);
  auVar3 = vpmovm2d_avx512vl(uVar4 & 0xf);
  local_1bc = vmovmskps_avx(auVar3);
  local_200 = PrevLow;
  if (local_1bc == 0xf) {
    auVar2 = vpsubd_avx((undefined1  [16])*PrevHi,auVar2);
    uVar4 = vpcmpgtd_avx512vl(auVar1,auVar2);
    auVar1 = vpmovm2d_avx512vl(uVar4 & 0xf);
    local_1bc = vmovmskps_avx(auVar1);
    local_1b4 = 4;
    local_200 = PrevHi;
  }
  auVar1 = vpshufb_avx((undefined1  [16])*local_200,
                       (undefined1  [16])streamvbyte_shuffle_mask[local_1bc ^ 0xf]);
  iVar5 = 0;
  for (local_1bc = local_1bc ^ 0xf; (local_1bc & 1) == 0; local_1bc = local_1bc >> 1 | 0x80000000) {
    iVar5 = iVar5 + 1;
  }
  out._0_4_ = auVar1._0_4_;
  *presult = (uint32_t)out;
  return local_1b4 + iVar5;
}

Assistant:

static inline int find_lower_bound(__m128i *PrevHi, __m128i *PrevLow,
                                   uint32_t key, uint32_t *presult) {
  int offset = 0;
  int s;

#if 0
    // scalar code:
    uint32_t out[8];
    _write_avx(out, *PrevLow);
    _write_avx(out + 4, *PrevHi);
    s = std::lower_bound(out, out + 8, key) - out;
    *presult = out[s];
    return (s);
#endif

  uint32_t mask;
  __m128i key4 = _mm_set1_epi32(key - 2147483648U);
  __m128i conversion = _mm_set1_epi32(2147483648U);
  __m128i tmp = _mm_sub_epi32(*PrevLow, conversion);
  mask = _mm_movemask_ps(_mm_castsi128_ps(_mm_cmplt_epi32(tmp, key4)));
  __m128i *out = PrevLow;
  // not found in PrevLow? then try PrevHi
  if (mask == 15) {
    tmp = _mm_sub_epi32(*PrevHi, conversion);
    mask = _mm_movemask_ps(_mm_castsi128_ps(_mm_cmplt_epi32(tmp, key4)));
    out = PrevHi;
    offset = 4;
  }
  // there MUST be a result!
  assert(mask != 15);
  const __m128i p = _mm_shuffle_epi8(*out, streamvbyte_shuffle_mask[mask ^ 15]);
  s = __builtin_ctz(mask ^ 15);
  *presult = _mm_cvtsi128_si32(p);

  return (offset + s);
}